

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O0

int archive_read_data_into_fd(archive *a,int fd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  int in_ESI;
  archive *in_RDI;
  char *p;
  int magic_test;
  size_t nulls_size;
  char *nulls;
  int can_lseek;
  int64_t actual_offset;
  int64_t target_offset;
  ssize_t bytes_written;
  size_t bytes_to_write;
  size_t size;
  void *buff;
  int r2;
  int r;
  stat_conflict st;
  int64_t *in_stack_fffffffffffffed8;
  size_t *in_stack_fffffffffffffee0;
  void **in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar5;
  void *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  size_t __size;
  void *__ptr;
  undefined4 in_stack_ffffffffffffff18;
  int64_t *local_e0;
  int64_t *local_d8;
  ssize_t in_stack_ffffffffffffff30;
  size_t local_c8;
  ulong local_c0;
  void *local_b8;
  int local_ac;
  uint local_90;
  char *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  archive *in_stack_ffffffffffffff88;
  int local_4;
  
  local_e0 = (int64_t *)0x0;
  __ptr = (void *)0x0;
  __size = 0x4000;
  iVar1 = __archive_check_magic
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    iVar2 = fstat(in_ESI,(stat *)&stack0xffffffffffffff58);
    uVar5 = iVar2 == 0 && (local_90 & 0xf000) == 0x8000;
    uVar3 = (uint)(byte)uVar5;
    if (uVar3 == 0) {
      __ptr = calloc(1,__size);
    }
    while (local_ac = archive_read_data_block
                                ((archive *)CONCAT17(uVar5,in_stack_fffffffffffffef0),
                                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                 in_stack_fffffffffffffed8), local_ac == 0) {
      in_stack_fffffffffffffef8 = local_b8;
      if ((long)local_e0 < (long)local_d8) {
        in_stack_fffffffffffffed8 = local_e0;
        local_ac = pad_to((archive *)CONCAT44(uVar3,in_stack_ffffffffffffff18),
                          (int)((ulong)__ptr >> 0x20),(int)__ptr,__size,
                          (char *)CONCAT44(iVar1,in_stack_ffffffffffffff00),(int64_t)local_b8,
                          in_stack_ffffffffffffff30);
        if (local_ac != 0) break;
        local_e0 = local_d8;
      }
      for (; local_c0 != 0; local_c0 = local_c0 - in_stack_ffffffffffffff30) {
        local_c8 = local_c0;
        if (0x100000 < local_c0) {
          local_c8 = 0x100000;
        }
        in_stack_ffffffffffffff30 = write(in_ESI,in_stack_fffffffffffffef8,local_c8);
        if (in_stack_ffffffffffffff30 < 0) {
          puVar4 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar4,"Write error");
          local_ac = -0x1e;
          goto LAB_0023885f;
        }
        local_e0 = (int64_t *)(in_stack_ffffffffffffff30 + (long)local_e0);
        in_stack_fffffffffffffef8 =
             (void *)(in_stack_ffffffffffffff30 + (long)in_stack_fffffffffffffef8);
      }
    }
    if (((local_ac == 1) && ((long)local_e0 < (long)local_d8)) &&
       (iVar1 = pad_to((archive *)CONCAT44(uVar3,in_stack_ffffffffffffff18),
                       (int)((ulong)__ptr >> 0x20),(int)__ptr,__size,
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffff00),
                       (int64_t)in_stack_fffffffffffffef8,in_stack_ffffffffffffff30), iVar1 != 0)) {
      local_ac = iVar1;
    }
LAB_0023885f:
    free(__ptr);
    if (local_ac == 1) {
      local_4 = 0;
    }
    else {
      local_4 = local_ac;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_data_into_fd(struct archive *a, int fd)
{
	struct stat st;
	int r, r2;
	const void *buff;
	size_t size, bytes_to_write;
	ssize_t bytes_written;
	int64_t target_offset;
	int64_t actual_offset = 0;
	int can_lseek;
	char *nulls = NULL;
	size_t nulls_size = 16384;

	archive_check_magic(a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_into_fd");

	can_lseek = (fstat(fd, &st) == 0) && S_ISREG(st.st_mode);
	if (!can_lseek)
		nulls = calloc(1, nulls_size);

	while ((r = archive_read_data_block(a, &buff, &size, &target_offset)) ==
	    ARCHIVE_OK) {
		const char *p = buff;
		if (target_offset > actual_offset) {
			r = pad_to(a, fd, can_lseek, nulls_size, nulls,
			    target_offset, actual_offset);
			if (r != ARCHIVE_OK)
				break;
			actual_offset = target_offset;
		}
		while (size > 0) {
			bytes_to_write = size;
			if (bytes_to_write > MAX_WRITE)
				bytes_to_write = MAX_WRITE;
			bytes_written = write(fd, p, bytes_to_write);
			if (bytes_written < 0) {
				archive_set_error(a, errno, "Write error");
				r = ARCHIVE_FATAL;
				goto cleanup;
			}
			actual_offset += bytes_written;
			p += bytes_written;
			size -= bytes_written;
		}
	}

	if (r == ARCHIVE_EOF && target_offset > actual_offset) {
		r2 = pad_to(a, fd, can_lseek, nulls_size, nulls,
		    target_offset, actual_offset);
		if (r2 != ARCHIVE_OK)
			r = r2;
	}

cleanup:
	free(nulls);
	if (r != ARCHIVE_EOF)
		return (r);
	return (ARCHIVE_OK);
}